

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

xmlAutomataStatePtr
xmlAutomataNewCountTrans
          (xmlAutomataPtr am,xmlAutomataStatePtr from,xmlAutomataStatePtr to,xmlChar *token,int min,
          int max,void *data)

{
  int iVar1;
  xmlRegAtomPtr atom_00;
  xmlChar *pxVar2;
  int counter;
  xmlRegAtomPtr atom;
  int max_local;
  int min_local;
  xmlChar *token_local;
  xmlAutomataStatePtr to_local;
  xmlAutomataStatePtr from_local;
  xmlAutomataPtr am_local;
  
  if (((((am != (xmlAutomataPtr)0x0) && (from != (xmlAutomataStatePtr)0x0)) &&
       (token != (xmlChar *)0x0)) && ((-1 < min && (min <= max)))) &&
     ((0 < max && (atom_00 = xmlRegNewAtom(am,XML_REGEXP_STRING), atom_00 != (xmlRegAtomPtr)0x0))))
  {
    pxVar2 = xmlStrdup(token);
    atom_00->valuep = pxVar2;
    if (atom_00->valuep != (void *)0x0) {
      atom_00->data = data;
      if (min == 0) {
        atom_00->min = 1;
      }
      else {
        atom_00->min = min;
      }
      atom_00->max = max;
      iVar1 = xmlRegGetCounter(am);
      if (-1 < iVar1) {
        am->counters[iVar1].min = min;
        am->counters[iVar1].max = max;
        token_local = (xmlChar *)to;
        if ((to != (xmlAutomataStatePtr)0x0) ||
           (token_local = (xmlChar *)xmlRegStatePush(am),
           (xmlRegStatePtr)token_local != (xmlRegStatePtr)0x0)) {
          xmlRegStateAddTrans(am,from,atom_00,(xmlRegStatePtr)token_local,iVar1,-1);
          iVar1 = xmlRegAtomPush(am,atom_00);
          if (-1 < iVar1) {
            am->state = (xmlRegStatePtr)token_local;
            if (token_local == (xmlChar *)0x0) {
              token_local = (xmlChar *)am->state;
            }
            if (token_local != (xmlChar *)0x0) {
              if (min == 0) {
                xmlFAGenerateEpsilonTransition(am,from,(xmlRegStatePtr)token_local);
              }
              return (xmlAutomataStatePtr)token_local;
            }
            return (xmlAutomataStatePtr)0x0;
          }
        }
      }
    }
    xmlRegFreeAtom(atom_00);
  }
  return (xmlAutomataStatePtr)0x0;
}

Assistant:

xmlAutomataStatePtr
xmlAutomataNewCountTrans(xmlAutomataPtr am, xmlAutomataStatePtr from,
			 xmlAutomataStatePtr to, const xmlChar *token,
			 int min, int max, void *data) {
    xmlRegAtomPtr atom;
    int counter;

    if ((am == NULL) || (from == NULL) || (token == NULL))
	return(NULL);
    if (min < 0)
	return(NULL);
    if ((max < min) || (max < 1))
	return(NULL);
    atom = xmlRegNewAtom(am, XML_REGEXP_STRING);
    if (atom == NULL)
	return(NULL);
    atom->valuep = xmlStrdup(token);
    if (atom->valuep == NULL)
        goto error;
    atom->data = data;
    if (min == 0)
	atom->min = 1;
    else
	atom->min = min;
    atom->max = max;

    /*
     * associate a counter to the transition.
     */
    counter = xmlRegGetCounter(am);
    if (counter < 0)
        goto error;
    am->counters[counter].min = min;
    am->counters[counter].max = max;

    /* xmlFAGenerateTransitions(am, from, to, atom); */
    if (to == NULL) {
	to = xmlRegStatePush(am);
        if (to == NULL)
            goto error;
    }
    xmlRegStateAddTrans(am, from, atom, to, counter, -1);
    if (xmlRegAtomPush(am, atom) < 0)
        goto error;
    am->state = to;

    if (to == NULL)
	to = am->state;
    if (to == NULL)
	return(NULL);
    if (min == 0)
	xmlFAGenerateEpsilonTransition(am, from, to);
    return(to);

error:
    xmlRegFreeAtom(atom);
    return(NULL);
}